

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::
parse_key_value_pair<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
          (result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc,size_t n_rec)

{
  pointer *ppbVar1;
  pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
  *ppVar2;
  const_iterator rollback;
  const_iterator rollback_00;
  undefined8 uVar3;
  value_type *pvVar4;
  value_type *v;
  error_type *peVar5;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var6;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var7;
  error_type *peVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
  *ctx;
  undefined8 uVar11;
  long lVar12;
  long *plVar13;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  string msg_1;
  result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  val;
  result<toml::detail::region,_toml::detail::none_t> keyval_sep;
  result<toml::detail::region,_toml::detail::none_t> kvsp;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  key_reg;
  allocator_type local_32a;
  allocator_type local_329;
  undefined1 local_328 [32];
  string local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined8 local_2b8;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  long local_288 [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined8 local_248;
  undefined1 local_238 [16];
  undefined1 local_228 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [4];
  undefined1 local_190 [24];
  region local_178;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> local_130;
  bool local_e8 [8];
  region local_e0;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  
  rollback._M_current = *(char **)(this + 0x40);
  parse_key_abi_cxx11_(&local_98,this,loc);
  if (local_98.is_ok_ == false) {
    peVar5 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap_err(&local_98);
    ppVar2 = (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
              *)(local_2a8 + 0x10);
    local_2a8._0_8_ = (peVar5->_M_dataplus)._M_p;
    paVar9 = &peVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._0_8_ == paVar9) {
      local_298._0_8_ = paVar9->_M_allocated_capacity;
      local_298._8_8_ = *(undefined8 *)((long)&peVar5->field_2 + 8);
      local_2a8._0_8_ = ppVar2;
    }
    else {
      local_298._0_8_ = paVar9->_M_allocated_capacity;
    }
    local_2a8._8_8_ = peVar5->_M_string_length;
    (peVar5->_M_dataplus)._M_p = (pointer)paVar9;
    peVar5->_M_string_length = 0;
    (peVar5->field_2)._M_local_buf[0] = '\0';
    sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::character<'='>,_toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>_>
    ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_190,(location *)this);
    if (local_190[0] == true) {
      location::reset((location *)this,rollback);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"toml::parse_key_value_pair: empty key is not allowed.","");
      source_location::source_location((source_location *)local_e8,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[24],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,(source_location *)local_e8,(char (*) [24])"key expected before \'=\'"
                );
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_238;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_308,__l_01,(allocator_type *)local_258._M_local_buf);
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8 = 0;
      format_underline((string *)local_328,(string *)&local_2e8,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_308,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2c8,false);
      std::__cxx11::string::operator=((string *)local_2a8,(string *)local_328);
      if ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)local_328._0_8_ !=
          (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)(local_328 + 0x10)) {
        operator_delete((void *)local_328._0_8_,CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2c8);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_allocated_capacity != local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity,
                        local_1d8[0]._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)local_238);
      source_location::~source_location((source_location *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_allocated_capacity != &local_2d8) {
        operator_delete((void *)local_2e8._M_allocated_capacity,local_2d8._M_allocated_capacity + 1)
        ;
      }
    }
    if (local_190[0] == true) {
      region::~region((region *)(local_190 + 8));
    }
    uVar3 = local_298._0_8_;
    uVar11 = local_2a8._8_8_;
    if ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
         *)local_2a8._0_8_ == ppVar2) {
      local_228._8_8_ = local_298._8_8_;
      local_238._0_8_ =
           (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
            *)local_228;
    }
    else {
      local_238._0_8_ = local_2a8._0_8_;
    }
    local_228._0_8_ = local_298._0_8_;
    local_238._8_8_ = local_2a8._8_8_;
    local_2a8._8_8_ = (pointer)0x0;
    local_298._0_8_ = local_298._0_8_ & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    ppbVar1 = (pointer *)
              ((long)&(__return_storage_ptr__->field_1).succ.value.first.first.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data + 0x10);
    (__return_storage_ptr__->field_1).succ.value.first.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    if ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
         *)local_238._0_8_ ==
        (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
         *)local_228) {
      *ppbVar1 = (pointer)uVar3;
      (__return_storage_ptr__->field_1).succ.value.first.second.super_region_base._vptr_region_base
           = (_func_int **)local_228._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->field_1).succ.value.first.first.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) = uVar3;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->field_1).succ.value.first.first.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data + 8) = uVar11;
    ctx = (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)local_238._0_8_;
    local_2a8._0_8_ = ppVar2;
    goto LAB_0012c310;
  }
  sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::character<'='>,_toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_e8,(location *)this);
  if (local_e8[0] == false) {
    ppVar2 = (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
              *)(local_328 + 0x10);
    local_328._8_8_ = (pointer)0x0;
    local_328[0x10] = '\0';
    local_238[0] = (string)0xa;
    local_328._0_8_ = ppVar2;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (*(undefined8 *)(this + 0x40),*(undefined8 *)(*(long *)(this + 8) + 8));
    local_238[0] = (string)0x3d;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (*(undefined8 *)(this + 0x40),_Var6._M_current);
    if (_Var7._M_current == _Var6._M_current) {
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"toml::parse_key_value_pair: missing key-value separator `=`",
                 "");
      source_location::source_location((source_location *)local_190,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[14],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,(source_location *)local_190,(char (*) [14])"should be `=`");
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)local_238;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_308,__l_03,(allocator_type *)local_258._M_local_buf);
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8 = 0;
      format_underline((string *)local_2a8,(string *)&local_2e8,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_308,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2c8,false);
      std::__cxx11::string::operator=((string *)local_328,(string *)local_2a8);
      if ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)local_2a8._0_8_ !=
          (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)(local_2a8 + 0x10)) {
        operator_delete((void *)local_2a8._0_8_,local_298._0_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2c8);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_allocated_capacity != local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity,
                        local_1d8[0]._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)local_238);
      source_location::~source_location((source_location *)local_190);
      uVar11 = local_2e8._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_allocated_capacity != &local_2d8) goto LAB_0012c0d8;
    }
    else {
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"toml::parse_key_value_pair: invalid format for key","");
      source_location::source_location((source_location *)local_190,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[25],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,(source_location *)local_190,(char (*) [25])"invalid character in key"
                );
      __l._M_len = 1;
      __l._M_array = (iterator)local_238;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_2c8,__l,&local_32a);
      local_2a8._0_8_ = local_2a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2a8,"Did you forget \'.\' to separate dotted-key?","");
      plVar13 = local_288 + 2;
      local_288[0] = (long)plVar13;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_288,"Allowed characters for bare key are [0-9a-zA-Z_-].","");
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)local_2a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_258,__l_00,&local_329);
      format_underline((string *)&local_2e8,&local_308,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_2c8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_258,false);
      std::__cxx11::string::operator=((string *)local_328,(string *)local_2e8._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_allocated_capacity != &local_2d8) {
        operator_delete((void *)local_2e8._M_allocated_capacity,local_2d8._M_allocated_capacity + 1)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_258);
      lVar12 = -0x40;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_allocated_capacity != local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity,
                        local_1d8[0]._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)local_238);
      source_location::~source_location((source_location *)local_190);
      local_2d8._M_allocated_capacity = local_308.field_2._M_allocated_capacity;
      uVar11 = local_308._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
LAB_0012c0d8:
        operator_delete((void *)uVar11,local_2d8._M_allocated_capacity + 1);
      }
    }
    location::reset((location *)this,rollback);
    uVar11 = local_328._8_8_;
    if ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
         *)local_328._0_8_ == ppVar2) {
      local_228._8_8_ = local_328._24_8_;
      local_238._0_8_ =
           (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
            *)local_228;
    }
    else {
      local_238._0_8_ = local_328._0_8_;
    }
    local_228._1_7_ = local_328._17_7_;
    local_228[0] = local_328[0x10];
    local_238._8_8_ = local_328._8_8_;
    local_328._8_8_ = 0;
    local_328[0x10] = '\0';
    __return_storage_ptr__->is_ok_ = false;
    paVar9 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    (__return_storage_ptr__->field_1).succ.value.first.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar9;
    if ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
         *)local_238._0_8_ ==
        (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
         *)local_228) {
      paVar9->_M_allocated_capacity = local_228._0_8_;
      (__return_storage_ptr__->field_1).succ.value.first.second.super_region_base._vptr_region_base
           = (_func_int **)local_228._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_228._0_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->field_1).succ.value.first.first.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data + 8) = uVar11;
    ctx = (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)local_238._0_8_;
    local_328._0_8_ = ppVar2;
  }
  else {
    rollback_00._M_current = *(char **)(this + 0x40);
    parse_value<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
              ((result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2a8,this,loc,n_rec);
    if (local_2a8[0] == (string)0x0) {
      local_328._8_8_ = 0;
      local_328[0x10] = '\0';
      local_328._0_8_ =
           (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
            *)(local_328 + 0x10);
      location::reset((location *)this,rollback_00);
      sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::maybe<toml::detail::sequence<toml::detail::character<'#'>,_toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<'\t'>,_toml::detail::in_range<'_',_'~'>_>,_toml::detail::sequence<toml::detail::in_range<'\xc2',_'\xdf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xf0'>,_toml::detail::in_range<'\x90',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xf1',_'\xf3'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xf4'>,_toml::detail::in_range<'\x80',_'\x8f'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::unlimited>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>
      ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_238,(location *)this);
      if (local_238[0] == (string)0x1) {
        region::~region((region *)(local_238 + 8));
        location::reset((location *)this,rollback_00);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,
                   "toml::parse_key_value_pair: missing value after key-value separator \'=\'","");
        source_location::source_location((source_location *)local_190,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[32],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_238,(source_location *)local_190,
                   (char (*) [32])"expected value, but got nothing");
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)local_238;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_2c8,__l_02,&local_32a);
        local_258._M_allocated_capacity = 0;
        local_258._8_8_ = 0;
        local_248 = 0;
        format_underline((string *)&local_2e8,&local_308,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2c8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_258,false);
        std::__cxx11::string::operator=((string *)local_328,(string *)local_2e8._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_allocated_capacity != &local_2d8) {
          operator_delete((void *)local_2e8._M_allocated_capacity,
                          local_2d8._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_258);
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_allocated_capacity != local_1d8) {
          operator_delete((void *)local_1e8._M_allocated_capacity,
                          local_1d8[0]._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)local_238);
        source_location::~source_location((source_location *)local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        peVar8 = result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::unwrap_err((result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_2a8);
        std::__cxx11::string::operator=((string *)local_328,(string *)peVar8);
      }
      location::reset((location *)this,rollback);
      ctx = (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
             *)local_328._0_8_;
      local_238._0_8_ =
           (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
            *)local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_328._0_8_,(pointer)(local_328._0_8_ + local_328._8_8_));
      __return_storage_ptr__->is_ok_ = false;
      ppbVar1 = (pointer *)
                ((long)&(__return_storage_ptr__->field_1).succ.value.first.first.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
      (__return_storage_ptr__->field_1).succ.value.first.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
      if ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)local_238._0_8_ ==
          (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)local_228) {
        *ppbVar1 = (pointer)local_228._0_8_;
        (__return_storage_ptr__->field_1).succ.value.first.second.super_region_base.
        _vptr_region_base = (_func_int **)local_228._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.first.first.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ.value.first.first.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = local_228._0_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->field_1).succ.value.first.first.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data + 8) = local_238._8_8_;
      if ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)local_328._0_8_ !=
          (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
           *)(local_328 + 0x10)) {
        ctx = (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
               *)(CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
        operator_delete((void *)local_328._0_8_,(ulong)ctx);
      }
    }
    else {
      pvVar4 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::unwrap(&local_98);
      v = result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::unwrap((result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2a8);
      local_190._0_8_ =
           (pvVar4->first).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_178.source_name_._M_dataplus._M_p = (pointer)&local_178.source_name_.field_2;
      local_190._8_8_ =
           (pvVar4->first).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_190._16_8_ =
           (pvVar4->first).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pvVar4->first).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pvVar4->first).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar4->first).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001d9f68;
      local_178.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (pvVar4->second).source_.
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_178.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (pvVar4->second).source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      (pvVar4->second).source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pvVar4->second).source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pvVar4->second).source_name_._M_dataplus._M_p;
      paVar10 = &(pvVar4->second).source_name_.field_2;
      if (paVar9 == paVar10) {
        local_178.source_name_.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_178.source_name_.field_2._8_8_ =
             *(undefined8 *)((long)&(pvVar4->second).source_name_.field_2 + 8);
      }
      else {
        local_178.source_name_.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_178.source_name_._M_dataplus._M_p = (pointer)paVar9;
      }
      local_178.source_name_._M_string_length = (pvVar4->second).source_name_._M_string_length;
      (pvVar4->second).source_name_._M_dataplus._M_p = (pointer)paVar10;
      (pvVar4->second).source_name_._M_string_length = 0;
      (pvVar4->second).source_name_.field_2._M_local_buf[0] = '\0';
      local_178.first_._M_current = (pvVar4->second).first_._M_current;
      local_178.last_._M_current = (pvVar4->second).last_._M_current;
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
                (&local_130,v);
      std::
      pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
      ::pair((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
              *)local_238,
             (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
              *)local_190);
      __return_storage_ptr__->is_ok_ = true;
      ctx = (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
             *)local_238;
      std::
      pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
      ::pair(&(__return_storage_ptr__->field_1).succ.value,ctx);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_1d8);
      region::~region((region *)(local_228 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value(&local_130)
      ;
      region::~region(&local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_190);
    }
    result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_2a8,(EVP_PKEY_CTX *)ctx);
  }
  if (local_e8[0] == true) {
    region::~region(&local_e0);
  }
LAB_0012c310:
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cleanup(&local_98,(EVP_PKEY_CTX *)ctx);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<std::pair<std::vector<key>, region>, Value>, std::string>
parse_key_value_pair(location& loc, const std::size_t n_rec)
{
    using value_type = Value;

    const auto first = loc.iter();
    auto key_reg = parse_key(loc);
    if(!key_reg)
    {
        std::string msg = std::move(key_reg.unwrap_err());
        // if the next token is keyvalue-separator, it means that there are no
        // key. then we need to show error as "empty key is not allowed".
        if(const auto keyval_sep = lex_keyval_sep::invoke(loc))
        {
            loc.reset(first);
            msg = format_underline("toml::parse_key_value_pair: "
                "empty key is not allowed.",
                {{source_location(loc), "key expected before '='"}});
        }
        return err(std::move(msg));
    }

    const auto kvsp = lex_keyval_sep::invoke(loc);
    if(!kvsp)
    {
        std::string msg;
        // if the line contains '=' after the invalid sequence, possibly the
        // error is in the key (like, invalid character in bare key).
        const auto line_end = std::find(loc.iter(), loc.end(), '\n');
        if(std::find(loc.iter(), line_end, '=') != line_end)
        {
            msg = format_underline("toml::parse_key_value_pair: "
                "invalid format for key",
                {{source_location(loc), "invalid character in key"}},
                {"Did you forget '.' to separate dotted-key?",
                "Allowed characters for bare key are [0-9a-zA-Z_-]."});
        }
        else // if not, the error is lack of key-value separator.
        {
            msg = format_underline("toml::parse_key_value_pair: "
                "missing key-value separator `=`",
                {{source_location(loc), "should be `=`"}});
        }
        loc.reset(first);
        return err(std::move(msg));
    }

    const auto after_kvsp = loc.iter(); // err msg
    auto val = parse_value<value_type>(loc, n_rec);
    if(!val)
    {
        std::string msg;
        loc.reset(after_kvsp);
        // check there is something not a comment/whitespace after `=`
        if(sequence<maybe<lex_ws>, maybe<lex_comment>, lex_newline>::invoke(loc))
        {
            loc.reset(after_kvsp);
            msg = format_underline("toml::parse_key_value_pair: "
                    "missing value after key-value separator '='",
                    {{source_location(loc), "expected value, but got nothing"}});
        }
        else // there is something not a comment/whitespace, so invalid format.
        {
            msg = std::move(val.unwrap_err());
        }
        loc.reset(first);
        return err(msg);
    }
    return ok(std::make_pair(std::move(key_reg.unwrap()),
                             std::move(val.unwrap())));
}